

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptBigInt.cpp
# Opt level: O0

JavascriptBigInt * Js::JavascriptBigInt::MulAbsolute(JavascriptBigInt *pbi1,JavascriptBigInt *pbi2)

{
  code *pcVar1;
  bool bVar2;
  JavascriptBigInt *length_00;
  ScriptContext *pSVar3;
  unsigned_long **ppuVar4;
  digit_t dVar5;
  undefined4 *puVar6;
  digit_t local_68;
  digit_t overflow;
  digit_t mulDigitResult;
  digit_t tempCarryDigit2;
  digit_t tempCarryDigit1;
  digit_t i2;
  digit_t i1;
  digit_t i3;
  digit_t carryDigit;
  JavascriptBigInt *pbi3;
  digit_t length;
  JavascriptBigInt *pbi2_local;
  JavascriptBigInt *pbi1_local;
  
  length_00 = (JavascriptBigInt *)(pbi1->m_length + pbi2->m_length);
  pbi3 = length_00;
  length = (digit_t)pbi2;
  pbi2_local = pbi1;
  if ((JavascriptBigInt *)0x1fffffffffffffff < length_00) {
    pSVar3 = RecyclableObject::GetScriptContext(&pbi1->super_RecyclableObject);
    JavascriptError::ThrowRangeError(pSVar3,-0x7ff5fff3,L"Multiply BigInt");
  }
  pSVar3 = RecyclableObject::GetScriptContext(&pbi1->super_RecyclableObject);
  carryDigit = (digit_t)CreateZeroWithLength((digit_t)length_00,pSVar3);
  i3 = 0;
  i1 = 0;
  i2 = 0;
  do {
    if (pbi2_local->m_length <= i2) {
      while( true ) {
        bVar2 = false;
        if (*(long *)(carryDigit + 0x18) != 0) {
          ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                              ((WriteBarrierPtr *)(carryDigit + 0x10));
          bVar2 = (*ppuVar4)[*(long *)(carryDigit + 0x18) + -1] == 0;
        }
        if (!bVar2) break;
        *(long *)(carryDigit + 0x18) = *(long *)(carryDigit + 0x18) + -1;
      }
      if (*(long *)(carryDigit + 0x18) == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0x25f,"(pbi3->m_length > 0)","pbi3->m_length > 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      return (JavascriptBigInt *)carryDigit;
    }
    i3 = 0;
    for (tempCarryDigit1 = 0; dVar5 = i3, tempCarryDigit1 < *(ulong *)(length + 0x18);
        tempCarryDigit1 = tempCarryDigit1 + 1) {
      i1 = i2 + tempCarryDigit1;
      tempCarryDigit2 = 0;
      mulDigitResult = 0;
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)(carryDigit + 0x10));
      dVar5 = AddDigit((*ppuVar4)[i1],i3,&tempCarryDigit2);
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)(carryDigit + 0x10));
      (*ppuVar4)[i1] = dVar5;
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)&pbi2_local->m_digits);
      dVar5 = (*ppuVar4)[i2];
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)(length + 0x10));
      overflow = MulDigit(dVar5,(*ppuVar4)[tempCarryDigit1],&i3);
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)(carryDigit + 0x10));
      dVar5 = AddDigit((*ppuVar4)[i1],overflow,&mulDigitResult);
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)(carryDigit + 0x10));
      (*ppuVar4)[i1] = dVar5;
      local_68 = 0;
      i3 = AddDigit(i3,tempCarryDigit2,&local_68);
      if (local_68 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0x250,"(overflow == 0)","overflow == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      i3 = AddDigit(i3,mulDigitResult,&local_68);
      if (local_68 != 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptBigInt.cpp"
                                    ,0x252,"(overflow == 0)","overflow == 0");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    if (i3 != 0) {
      ppuVar4 = Memory::WriteBarrierPtr::operator_cast_to_unsigned_long__
                          ((WriteBarrierPtr *)(carryDigit + 0x10));
      (*ppuVar4)[i1 + 1] = dVar5;
    }
    i2 = i2 + 1;
  } while( true );
}

Assistant:

JavascriptBigInt * JavascriptBigInt::MulAbsolute(JavascriptBigInt * pbi1, JavascriptBigInt * pbi2)
    {
        // Start with maximum length possible in pbi3
        digit_t length = pbi1->m_length + pbi2->m_length;
        if (SIZE_MAX / sizeof(digit_t) < length) // overflow 
        {
            JavascriptError::ThrowRangeError(pbi1->GetScriptContext(), VBSERR_TypeMismatch, _u("Multiply BigInt"));
        }
        JavascriptBigInt * pbi3 = JavascriptBigInt::CreateZeroWithLength(length, pbi1->GetScriptContext());

        // Compute pbi3 = pbi1 * pbi2 as follow:
        // e.g. A1 A0 * B1 B0 = C3 C2 C1 C0
        // C0 = A0 * B0 (take the digit and carry)
        // C1 = carry + A0 * B1 + A1 * B0 (take the digit and carry)
        // C2 = carry + A1 * B1 (take the digit and carry)
        // C3 = carry
        digit_t carryDigit = 0;
        digit_t i3 = 0;

        for (digit_t i1 = 0; i1 < pbi1->m_length; i1++)
        {
            carryDigit = 0;
            for (digit_t i2 = 0; i2 < pbi2->m_length; i2++)
            {
                i3 = i1 + i2;
                digit_t tempCarryDigit1 = 0;
                digit_t tempCarryDigit2 = 0;
                pbi3->m_digits[i3] = JavascriptBigInt::AddDigit(pbi3->m_digits[i3], carryDigit, &tempCarryDigit1);
                digit_t mulDigitResult = JavascriptBigInt::MulDigit(pbi1->m_digits[i1], pbi2->m_digits[i2], &carryDigit);
                pbi3->m_digits[i3] = JavascriptBigInt::AddDigit(pbi3->m_digits[i3], mulDigitResult, &tempCarryDigit2);
                digit_t overflow = 0;
                carryDigit = JavascriptBigInt::AddDigit(carryDigit, tempCarryDigit1, &overflow);
                Assert(overflow == 0); // [i1] * [i2] can not carry through [i1+i2+2]
                carryDigit = JavascriptBigInt::AddDigit(carryDigit, tempCarryDigit2, &overflow);
                Assert(overflow == 0); // [i1] * [i2] can not carry through [i1+i2+2]
            }
            if (carryDigit > 0)
            {
                pbi3->m_digits[i3 + 1] = carryDigit;
            }
        }
        
        // adjust length
        while ((pbi3->m_length > 0) && (pbi3->m_digits[pbi3->m_length - 1] == 0))
        {
            pbi3->m_length--;
        }
        Assert(pbi3->m_length > 0);
        return pbi3;
    }